

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image
          (Fl_PostScript_Graphics_Driver *this,Fl_Draw_Image_Cb call,void *data,int ix,int iy,int iw
          ,int ih,int D)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  uchar *puVar7;
  undefined8 *data_00;
  void *pvVar8;
  byte b;
  byte b_00;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  byte *pbVar15;
  uchar *puVar16;
  byte b_01;
  long lVar17;
  undefined4 uVar18;
  uchar *local_50;
  
  dVar3 = (double)iy;
  dVar4 = (double)iw;
  dVar5 = (double)ih;
  fwrite("save\n",5,1,(FILE *)this->output);
  iVar6 = this->lang_level_;
  uVar18 = SUB84((double)ix,0);
  if (iVar6 < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i CI",uVar18,dVar3 + dVar5,dVar4,-dVar5,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    pcVar12 = "true";
    if (this->interpolate_ == 0) {
      pcVar12 = "false";
    }
    if (iVar6 == 2 || this->mask == (uchar *)0x0) {
      if (iVar6 == 2 && this->mask != (uchar *)0x0) {
        fprintf((FILE *)this->output," %g %g %g %g %d %d pixmap_plot\n",uVar18,dVar3,dVar4,
                (ulong)(uint)iw,(ulong)(uint)ih);
        bVar2 = false;
        goto LAB_002087e6;
      }
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s CII\n",uVar18,dVar3 + dVar5,dVar4,-dVar5,
              (ulong)(uint)iw,(ulong)(uint)ih);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s CIM\n",uVar18,dVar3 + dVar5,dVar4,
              -dVar5,(ulong)(uint)iw,(ulong)(uint)ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,
              pcVar12);
    }
  }
  bVar2 = true;
LAB_002087e6:
  puVar7 = (uchar *)operator_new__((long)(D * iw));
  local_50 = this->mask;
  data_00 = (undefined8 *)operator_new(0x90);
  data_00[0x11] = 0;
  pvVar8 = operator_new(0x14);
  *(undefined8 *)((long)pvVar8 + 4) = 0;
  *data_00 = pvVar8;
  if (bVar2) {
    if (0 < ih) {
      iVar6 = 0;
      do {
        if (((this->mask != (uchar *)0x0) && (2 < this->lang_level_)) &&
           (iVar13 = this->my, 0 < iVar13 / ih)) {
          iVar11 = this->mx;
          iVar14 = 0;
          do {
            if (0 < iVar11) {
              lVar17 = 0;
              do {
                write_rle85(this,""[local_50[lVar17] & 0xf] << 4 | ""[local_50[lVar17] >> 4],data_00
                           );
                iVar11 = this->mx;
                iVar13 = iVar11 + 0xe;
                if (-1 < iVar11 + 7) {
                  iVar13 = iVar11 + 7;
                }
                lVar17 = lVar17 + 1;
              } while ((int)lVar17 < iVar13 >> 3);
              iVar13 = this->my;
              local_50 = local_50 + lVar17;
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < iVar13 / ih);
        }
        (*call)(data,0,iVar6,iw,puVar7);
        pbVar15 = puVar7 + 3;
        iVar13 = iw;
        if (0 < iw) {
          do {
            b = pbVar15[-3];
            b_00 = pbVar15[-2];
            b_01 = pbVar15[-1];
            if ((3 < D) && (this->lang_level_ < 3)) {
              bVar1 = *pbVar15;
              uVar10 = bVar1 ^ 0xff;
              b = (byte)((this->bg_r * uVar10 + (uint)b * (uint)bVar1) / 0xff);
              b_00 = (byte)((this->bg_g * uVar10 + (uint)b_00 * (uint)bVar1) / 0xff);
              b_01 = (byte)((this->bg_b * uVar10 + (uint)b_01 * (uint)bVar1) / 0xff);
            }
            write_rle85(this,b,data_00);
            write_rle85(this,b_00,data_00);
            write_rle85(this,b_01,data_00);
            iVar13 = iVar13 + -1;
            pbVar15 = pbVar15 + D;
          } while (iVar13 != 0);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != ih);
    }
  }
  else {
    if (0 < ih) {
      iVar6 = ih + -1;
      do {
        (*call)(data,0,iVar6,iw,puVar7);
        puVar16 = puVar7 + 2;
        iVar13 = iw;
        if (0 < iw) {
          do {
            write_rle85(this,puVar16[-2],data_00);
            write_rle85(this,puVar16[-1],data_00);
            write_rle85(this,*puVar16,data_00);
            iVar13 = iVar13 + -1;
            puVar16 = puVar16 + D;
          } while (iVar13 != 0);
        }
        bVar2 = 0 < iVar6;
        iVar6 = iVar6 + -1;
      } while (bVar2);
    }
    close_rle85(this,data_00);
    fputc(10,(FILE *)this->output);
    data_00 = (undefined8 *)operator_new(0x90);
    data_00[0x11] = 0;
    pvVar8 = operator_new(0x14);
    *(undefined8 *)((long)pvVar8 + 4) = 0;
    *data_00 = pvVar8;
    if (0 < ih) {
      iVar6 = this->mx;
      iVar13 = this->my;
      iVar11 = iVar6;
      iVar14 = ih + -1;
      do {
        if (0 < iVar13 / ih) {
          iVar9 = iVar11 + 0xe;
          if (-1 < iVar11 + 7) {
            iVar9 = iVar11 + 7;
          }
          puVar16 = this->mask + (iVar9 >> 3) * (iVar13 / ih) * iVar14;
          iVar9 = 0;
          do {
            if (0 < iVar6) {
              lVar17 = 0;
              do {
                write_rle85(this,""[puVar16[lVar17] & 0xf] << 4 | ""[puVar16[lVar17] >> 4],data_00);
                iVar6 = this->mx;
                iVar13 = iVar6 + 0xe;
                if (-1 < iVar6 + 7) {
                  iVar13 = iVar6 + 7;
                }
                lVar17 = lVar17 + 1;
              } while ((int)lVar17 < iVar13 >> 3);
              iVar13 = this->my;
              puVar16 = puVar16 + lVar17;
            }
            iVar9 = iVar9 + 1;
            iVar11 = iVar6;
          } while (iVar9 < iVar13 / ih);
        }
        bVar2 = 0 < iVar14;
        iVar14 = iVar14 + -1;
      } while (bVar2);
    }
  }
  close_rle85(this,data_00);
  fwrite("\nrestore\n",9,1,(FILE *)this->output);
  operator_delete__(puVar7);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image(Fl_Draw_Image_Cb call, void *data, int ix, int iy, int iw, int ih, int D) {
  double x = ix, y = iy, w = iw, h = ih;

  int level2_mask = 0;
  fprintf(output,"save\n");
  int i,j,k;
  const char * interpol;
  if (lang_level_ > 1) {
    if (interpolate_) interpol="true";
    else interpol="false";
    if (mask && lang_level_ > 2) {
      fprintf(output, "%g %g %g %g %i %i %i %i %s CIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    }
    else if (mask && lang_level_ == 2) {
      level2_mask = 1; // use method for drawing masked color image with PostScript level 2
      fprintf(output, " %g %g %g %g %d %d pixmap_plot\n", x, y, w, h, iw, ih);
    }
    else {
      fprintf(output, "%g %g %g %g %i %i %s CII\n", x , y+h , w , -h , iw , ih, interpol);
    }
  } else {
    fprintf(output , "%g %g %g %g %i %i CI", x , y+h , w , -h , iw , ih);
  }
  
  int LD=iw*D;
  uchar *rgbdata=new uchar[LD];
  uchar *curmask=mask;
  void *big = prepare_rle85();
  
  if (level2_mask) {
    for (j = ih - 1; j >= 0; j--) { // output full image data
      call(data, 0, j, iw, rgbdata);
      uchar *curdata = rgbdata;
      for (i=0 ; i<iw ; i++) {
        write_rle85(curdata[0], big); write_rle85(curdata[1], big); write_rle85(curdata[2], big);
        curdata += D;
      }
    }
    close_rle85(big); fputc('\n', output);
    big = prepare_rle85();
    for (j = ih - 1; j >= 0; j--) { // output mask data
      curmask = mask + j * (my/ih) * ((mx+7)/8);
      for (k=0; k < my/ih; k++) {
        for (i=0; i < ((mx+7)/8); i++) {
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
  }
  else {
    for (j=0; j<ih;j++) {
      if (mask && lang_level_ > 2) {  // InterleaveType 2 mask data
        for (k=0; k<my/ih;k++) { //for alpha pseudo-masking
          for (i=0; i<((mx+7)/8);i++) {
            write_rle85(swap_byte(*curmask), big);
            curmask++;
          }
        }
      }
      call(data,0,j,iw,rgbdata);
      uchar *curdata=rgbdata;
      for (i=0 ; i<iw ; i++) {
        uchar r = curdata[0];
        uchar g =  curdata[1];
        uchar b =  curdata[2];
        
        if (lang_level_<3 && D>3) { //can do  mixing using bg_* colors)
          unsigned int a2 = curdata[3]; //must be int
          unsigned int a = 255-a2;
          r = (a2 * r + bg_r * a)/255;
          g = (a2 * g + bg_g * a)/255;
          b = (a2 * b + bg_b * a)/255;
        }
        
        write_rle85(r, big); write_rle85(g, big); write_rle85(b, big);
        curdata +=D;
      }
      
    }
  }
  close_rle85(big);
  fprintf(output,"\nrestore\n");
  delete[] rgbdata;
}